

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-sdg-dump.cpp
# Opt level: O3

void __thiscall SDGDumper::dumpToDot(SDGDumper *this,char *suffix)

{
  pointer pcVar1;
  size_t sVar2;
  raw_ostream *prVar3;
  StringRef Str;
  StringRef Str_00;
  string fl;
  SDG2Dot dumper;
  string local_80;
  undefined1 local_60 [24];
  _Link_type local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  size_t local_30;
  
  pcVar1 = (this->options->inputFile)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->options->inputFile)._M_string_length);
  if (suffix == (char *)0x0) {
    local_60._0_8_ = (SystemDependenceGraph *)(local_60 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,".dot","");
    replace_suffix((string *)&local_80,(string *)local_60);
    if ((SystemDependenceGraph *)local_60._0_8_ == (SystemDependenceGraph *)(local_60 + 0x10))
    goto LAB_0010f5ab;
  }
  else {
    local_60._0_8_ = (SystemDependenceGraph *)(local_60 + 0x10);
    sVar2 = strlen(suffix);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,suffix,suffix + sVar2);
    replace_suffix((string *)&local_80,(string *)local_60);
    if ((SystemDependenceGraph *)local_60._0_8_ == (SystemDependenceGraph *)(local_60 + 0x10))
    goto LAB_0010f5ab;
  }
  operator_delete((void *)local_60._0_8_,CONCAT44(local_60._20_4_,local_60._16_4_) + 1);
LAB_0010f5ab:
  prVar3 = (raw_ostream *)llvm::errs();
  Str.Length = 0xf;
  Str.Data = "Dumping SDG to ";
  prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
  prVar3 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar3,(ulong)local_80._M_dataplus._M_p);
  Str_00.Length = 1;
  Str_00.Data = "\n";
  llvm::raw_ostream::operator<<(prVar3,Str_00);
  if (this->bb_only == false) {
    local_60._0_8_ = this->dg;
    local_40 = (_Base_ptr)(local_60 + 0x10);
    local_60._16_4_ = _S_red;
    local_48 = (_Link_type)0x0;
    local_30 = 0;
    local_38 = local_40;
    dg::llvmdg::SDG2Dot::dump((SDG2Dot *)local_60,&local_80);
    std::
    _Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
    ::_M_erase((_Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                *)(local_60 + 8),local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dumpToDot(const char *suffix = nullptr) {
        // compose new name
        std::string fl(options.inputFile);
        if (suffix)
            replace_suffix(fl, suffix);
        else
            replace_suffix(fl, ".dot");

        errs() << "Dumping SDG to " << fl << "\n";

        if (bb_only) {
            assert(false && "Not implemented");
            // SDGDumpBlocks dumper(dg, dump_opts, fl.c_str());
            // dumper.dump();
        } else {
            llvmdg::SDG2Dot dumper(dg);
            dumper.dump(fl);
        }
    }